

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-ben.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer puVar1;
  __uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> _Var2;
  Value *val;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Offset OVar9;
  uint uVar10;
  ulong *puVar11;
  op_iterator pUVar12;
  PSNode *pPVar13;
  PSNode *pPVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  char *pcVar19;
  int iVar20;
  PSNode *pPVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  long lVar25;
  uint uVar26;
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *node;
  pointer puVar27;
  uint uVar28;
  CallBase *pCVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  const_iterator __begin1;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  DGLLVMPointerAnalysis PTA;
  SlicerOptions options;
  undefined1 local_430 [8];
  undefined1 local_428 [24];
  long local_410;
  Pointer local_408;
  PSNode *local_3f8;
  PSNode *local_3f0;
  PSNode *local_3e8;
  PSNode *local_3e0;
  Pointer local_3d8;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> local_3c8;
  undefined1 local_3c0 [8];
  DGLLVMPointerAnalysis local_3b8;
  TimeMeasure local_328;
  undefined1 local_310 [96];
  size_type sStack_2b0;
  AnalysisType local_2a8;
  bool local_2a4;
  undefined1 local_2a0 [96];
  size_type sStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [32];
  
  setupStackTraceOnError(argc,argv);
  iVar20 = 1;
  parseSlicerOptions((int)local_2a0,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  llvm::LLVMContext::LLVMContext((LLVMContext *)local_3c0);
  parseModule((char *)&local_3c8,(LLVMContext *)"llvm-pta-ben",(SlicerOptions *)local_3c0);
  if (local_3c8._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)0x0) {
    local_310._0_8_ = local_310 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_310,local_2a0._0_8_,(pointer)(local_2a0._0_8_ + local_2a0._8_8_));
    local_310._32_8_ = local_2a0._32_8_;
    std::
    _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
    ::_Rb_tree((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                *)(local_310 + 0x28),
               (_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                *)(local_2a0 + 0x28));
    local_310._88_8_ = local_2a0._88_8_;
    sStack_2b0 = sStack_240;
    local_2a8 = (undefined4)local_238[0]._M_allocated_capacity;
    local_2a4 = (bool)local_238[0]._4_1_;
    dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
              ((DGLLVMPointerAnalysis *)(local_3c0 + 8),
               (Module *)
               local_3c8._M_t.
               super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
               super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
               super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl,
               (LLVMPointerAnalysisOptions *)local_310);
    std::
    _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
    ::_M_erase((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                *)(local_310 + 0x28),(_Link_type)local_310._56_8_);
    if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
      operator_delete((void *)local_310._0_8_,local_310._16_8_ + 1);
    }
    local_328.s.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    dg::DGLLVMPointerAnalysis::run((DGLLVMPointerAnalysis *)(local_3c0 + 8));
    local_328.e.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_430 = (undefined1  [8])(local_428 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_430,"INFO: Pointer analysis took","");
    dg::debug::TimeMeasure::report(&local_328,(string *)local_430,(ostream *)&std::cerr);
    if (local_430 != (undefined1  [8])(local_428 + 8)) {
      operator_delete((void *)local_430,local_428._8_8_ + 1);
    }
    puVar27 = ((local_3b8.PS)->nodes).
              super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = ((local_3b8.PS)->nodes).
             super__Vector_base<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar27 != puVar1) {
      local_3e0 = dg::Offset::UNKNOWN;
      do {
        _Var2._M_t.super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
        super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl =
             (puVar27->_M_t).
             super___uniq_ptr_impl<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>._M_t;
        if (((((_Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>)
               _Var2._M_t.
               super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>.
               super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl == (PSNode *)0x0) ||
             (*(int *)((long)_Var2._M_t.
                             super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>
                             .super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl + 0x90)
              != 8)) ||
            (pCVar29 = *(CallBase **)
                        ((long)_Var2._M_t.
                               super__Tuple_impl<0UL,_dg::pta::PSNode_*,_std::default_delete<dg::pta::PSNode>_>
                               .super__Head_base<0UL,_dg::pta::PSNode_*,_false>._M_head_impl + 0x18)
            , pCVar29 == (CallBase *)0x0)) ||
           (((pCVar29[0x10] != (CallBase)0x53 || (lVar25 = *(long *)(pCVar29 + -0x20), lVar25 == 0))
            || ((*(char *)(lVar25 + 0x10) != '\0' ||
                (*(long *)(lVar25 + 0x18) != *(long *)(pCVar29 + 0x48)))))))
        goto switchD_0010c9bd_caseD_3;
        auVar36 = llvm::Value::getName();
        puVar11 = auVar36._0_8_;
        pUVar12 = llvm::CallBase::arg_end(pCVar29);
        pCVar29 = pCVar29 + -(ulong)(uint)(*(int *)(pCVar29 + 0x14) << 5);
        if (((long)pUVar12 - (long)pCVar29 & 0x1fffffffe0U) != 0x40) goto switchD_0010c9bd_caseD_3;
        lVar25 = auVar36._8_8_ + -7;
        switch(lVar25) {
        case 0:
          if (*(int *)((long)puVar11 + 3) != 0x5341494c || (int)*puVar11 != 0x4c414f4e) break;
          goto LAB_0010ca78;
        case 1:
          if (*puVar11 == 0x5341494c4159414d) goto LAB_0010ca78;
          break;
        case 2:
          uVar17 = *puVar11 ^ 0x41494c415453554d;
          uVar28 = (byte)puVar11[1] ^ 0x53;
          goto LAB_0010ca45;
        case 5:
          uVar17 = *puVar11 ^ 0x414c414954524150;
          uVar28 = (uint)puVar11[1] ^ 0x5341494c;
LAB_0010ca45:
          if (uVar28 == 0 && uVar17 == 0) {
LAB_0010ca78:
            val = *(Value **)(pCVar29 + 0x20);
            local_410 = lVar25;
            pPVar13 = dg::pta::LLVMPointerGraphBuilder::getPointsToNode
                                ((LLVMPointerGraphBuilder *)
                                 local_3b8._builder._M_t.
                                 super___uniq_ptr_impl<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                                 .super__Head_base<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_false>.
                                 _M_head_impl,*(Value **)pCVar29);
            pPVar14 = dg::pta::LLVMPointerGraphBuilder::getPointsToNode
                                ((LLVMPointerGraphBuilder *)
                                 local_3b8._builder._M_t.
                                 super___uniq_ptr_impl<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
                                 .super__Head_base<0UL,_dg::pta::LLVMPointerGraphBuilder_*,_false>.
                                 _M_head_impl,val);
            local_430 = *(undefined1 (*) [8])(pPVar13 + 0xc0);
            local_428._0_16_ = (undefined1  [16])0x0;
            uVar28 = 0;
            if (*(long *)(pPVar13 + 200) == 0) {
              bVar30 = false;
            }
            else {
              uVar16 = 0;
              uVar17 = *(ulong *)((long)local_430 + 0x10) & 1;
              while (uVar17 == 0) {
                if (uVar16 == 0x3f) {
                  uVar16 = 0x40;
                  break;
                }
                bVar15 = (byte)uVar16;
                uVar16 = uVar16 + 1;
                uVar17 = *(ulong *)((long)local_430 + 0x10) >> (bVar15 & 0x3f) & 2;
              }
              auVar3._8_8_ = 0;
              auVar3._0_8_ = uVar16;
              local_428._0_16_ = auVar3 << 0x40;
              bVar30 = uVar16 != 0;
            }
            local_3f0 = pPVar13;
            if ((bVar30) || (local_430 != (undefined1  [8])0x0)) {
              uVar28 = 0;
              do {
                do {
                  uVar28 = uVar28 + 1;
                  dg::ADT::
                  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                  ::const_iterator::operator++((const_iterator *)local_430);
                } while (local_428._8_8_ != 0);
              } while (local_430 != (undefined1  [8])0x0);
            }
            local_430 = *(undefined1 (*) [8])(pPVar14 + 0xc0);
            local_428._0_16_ = (undefined1  [16])0x0;
            uVar26 = 0;
            if (*(long *)(pPVar14 + 200) == 0) {
              bVar30 = false;
            }
            else {
              uVar16 = 0;
              uVar17 = *(ulong *)((long)local_430 + 0x10) & 1;
              while (uVar17 == 0) {
                if (uVar16 == 0x3f) {
                  uVar16 = 0x40;
                  break;
                }
                bVar15 = (byte)uVar16;
                uVar16 = uVar16 + 1;
                uVar17 = *(ulong *)((long)local_430 + 0x10) >> (bVar15 & 0x3f) & 2;
              }
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar16;
              local_428._0_16_ = auVar4 << 0x40;
              bVar30 = uVar16 != 0;
            }
            if ((bVar30) || (local_430 != (undefined1  [8])0x0)) {
              uVar26 = 0;
              do {
                do {
                  uVar26 = uVar26 + 1;
                  dg::ADT::
                  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                  ::const_iterator::operator++((const_iterator *)local_430);
                } while (local_428._8_8_ != 0);
              } while (local_430 != (undefined1  [8])0x0);
            }
            printf("counts = %d %d\n",(ulong)uVar28,(ulong)uVar26);
            pPVar13 = dg::pta::UNKNOWN_MEMORY;
            if ((uVar26 | uVar28) < 2) {
              local_408.target = dg::pta::UNKNOWN_MEMORY;
              local_408.offset.offset = (type)local_3e0;
              local_3d8.target = dg::pta::UNKNOWN_MEMORY;
              local_3d8.offset.offset = (type)local_3e0;
              uVar10 = 1;
              local_3f8 = pPVar14;
              if ((uVar26 | uVar28) != 0) {
                local_3e8 = local_3e0;
                pPVar14 = dg::pta::UNKNOWN_MEMORY;
                if (uVar28 == 1) {
                  local_430 = *(undefined1 (*) [8])(local_3f0 + 0xc0);
                  local_428._0_16_ = (undefined1  [16])0x0;
                  if (*(long *)(local_3f0 + 200) == 0) {
                    uVar17 = 0;
                  }
                  else {
                    uVar17 = 0;
                    uVar16 = *(ulong *)((long)local_430 + 0x10) & 1;
                    while (uVar16 == 0) {
                      if (uVar17 == 0x3f) {
                        uVar17 = 0x40;
                        break;
                      }
                      bVar15 = (byte)uVar17;
                      uVar17 = uVar17 + 1;
                      uVar16 = *(ulong *)((long)local_430 + 0x10) >> (bVar15 & 0x3f) & 2;
                    }
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = uVar17;
                    local_428._0_16_ = auVar7 << 0x40;
                  }
                  do {
                    lVar25 = uVar17 * 0x10 + llvm::DisableABIBreakingChecks;
                    pPVar14 = *(PSNode **)(*(long *)((long)local_430 + 8) * 0x10 + -0x10 + lVar25);
                    local_3e8 = *(PSNode **)(*(long *)((long)local_430 + 8) * 0x10 + -8 + lVar25);
                    if ((pPVar14 != dg::pta::NULLPTR) && (pPVar14 != dg::pta::UNKNOWN_MEMORY))
                    break;
                    dg::ADT::
                    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                    ::const_iterator::operator++((const_iterator *)local_430);
                    uVar17 = local_428._8_8_;
                  } while (local_430 != (undefined1  [8])0x0 || local_428._8_8_ != 0);
                }
                pPVar21 = local_3e0;
                local_408.target = pPVar14;
                local_408.offset.offset = (type)local_3e8;
                local_3f0 = pPVar14;
                pPVar14 = local_3d8.target;
                OVar9.offset = local_3d8.offset.offset;
                if (uVar26 == 1) {
                  local_430 = *(undefined1 (*) [8])(local_3f8 + 0xc0);
                  local_428._0_16_ = (undefined1  [16])0x0;
                  if (*(long *)(local_3f8 + 200) == 0) {
                    uVar17 = 0;
                  }
                  else {
                    uVar17 = 0;
                    uVar16 = *(ulong *)((long)local_430 + 0x10) & 1;
                    while (uVar16 == 0) {
                      if (uVar17 == 0x3f) {
                        uVar17 = 0x40;
                        break;
                      }
                      bVar15 = (byte)uVar17;
                      uVar17 = uVar17 + 1;
                      uVar16 = *(ulong *)((long)local_430 + 0x10) >> (bVar15 & 0x3f) & 2;
                    }
                    auVar8._8_8_ = 0;
                    auVar8._0_8_ = uVar17;
                    local_428._0_16_ = auVar8 << 0x40;
                  }
                  do {
                    lVar25 = uVar17 * 0x10 + llvm::DisableABIBreakingChecks;
                    pPVar13 = *(PSNode **)(*(long *)((long)local_430 + 8) * 0x10 + -0x10 + lVar25);
                    pPVar21 = *(PSNode **)(*(long *)((long)local_430 + 8) * 0x10 + -8 + lVar25);
                    pPVar14 = pPVar13;
                    OVar9.offset = (type)pPVar21;
                    if ((pPVar13 != dg::pta::NULLPTR) && (pPVar13 != dg::pta::UNKNOWN_MEMORY))
                    break;
                    dg::ADT::
                    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                    ::const_iterator::operator++((const_iterator *)local_430);
                    uVar17 = local_428._8_8_;
                  } while (local_430 != (undefined1  [8])0x0 || local_428._8_8_ != 0);
                }
                local_3d8.offset.offset = OVar9.offset;
                local_3d8.target = pPVar14;
                if (uVar28 == 0) {
                  uVar10 = check_pointer(&local_3d8,"2");
                }
                else if (uVar26 == 0) {
                  uVar10 = check_pointer(&local_408,"1");
                }
                else {
                  local_3f8 = pPVar21;
                  dump_pointer(&local_408,"1");
                  dump_pointer(&local_3d8,"2");
                  uVar10 = 2;
                  if (((local_3f0 != dg::pta::UNKNOWN_MEMORY) &&
                      (pPVar13 != dg::pta::UNKNOWN_MEMORY)) &&
                     ((local_3f0 != pPVar13 ||
                      (((local_3e8 != local_3e0 && (local_3f8 != local_3e0)) &&
                       (uVar10 = 3, local_3e8 != local_3f8)))))) {
                    uVar10 = 1;
                  }
                }
              }
            }
            else {
              local_430 = *(undefined1 (*) [8])(local_3f0 + 0xc0);
              local_428._0_16_ = (undefined1  [16])0x0;
              if (*(long *)(local_3f0 + 200) == 0) {
                uVar17 = 0;
              }
              else {
                uVar17 = 0;
                uVar16 = *(ulong *)((long)local_430 + 0x10) & 1;
                while (uVar16 == 0) {
                  if (uVar17 == 0x3f) {
                    uVar17 = 0x40;
                    break;
                  }
                  bVar15 = (byte)uVar17;
                  uVar17 = uVar17 + 1;
                  uVar16 = *(ulong *)((long)local_430 + 0x10) >> (bVar15 & 0x3f) & 2;
                }
                auVar5._8_8_ = 0;
                auVar5._0_8_ = uVar17;
                local_428._0_16_ = auVar5 << 0x40;
              }
              if ((uVar17 != 0) || (local_430 != (undefined1  [8])0x0)) {
                do {
                  lVar25 = uVar17 * 0x10 + llvm::DisableABIBreakingChecks;
                  local_408.target =
                       *(PSNode **)(*(long *)((long)local_430 + 8) * 0x10 + -0x10 + lVar25);
                  local_408.offset.offset =
                       *(undefined8 *)(*(long *)((long)local_430 + 8) * 0x10 + -8 + lVar25);
                  if ((local_408.target != dg::pta::NULLPTR) &&
                     (local_408.target != dg::pta::UNKNOWN_MEMORY)) {
                    dump_pointer(&local_408,"1");
                  }
                  dg::ADT::
                  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                  ::const_iterator::operator++((const_iterator *)local_430);
                  uVar17 = local_428._8_8_;
                } while (local_430 != (undefined1  [8])0x0 || local_428._8_8_ != 0);
              }
              local_430 = *(undefined1 (*) [8])(pPVar14 + 0xc0);
              local_428._0_16_ = (undefined1  [16])0x0;
              if (*(long *)(pPVar14 + 200) == 0) {
                uVar17 = 0;
              }
              else {
                uVar17 = 0;
                uVar16 = *(ulong *)((long)local_430 + 0x10) & 1;
                while (uVar16 == 0) {
                  if (uVar17 == 0x3f) {
                    uVar17 = 0x40;
                    break;
                  }
                  bVar15 = (byte)uVar17;
                  uVar17 = uVar17 + 1;
                  uVar16 = *(ulong *)((long)local_430 + 0x10) >> (bVar15 & 0x3f) & 2;
                }
                auVar6._8_8_ = 0;
                auVar6._0_8_ = uVar17;
                local_428._0_16_ = auVar6 << 0x40;
              }
              if ((uVar17 != 0) || (local_430 != (undefined1  [8])0x0)) {
                do {
                  lVar25 = uVar17 * 0x10 + llvm::DisableABIBreakingChecks;
                  local_408.target =
                       *(PSNode **)(*(long *)((long)local_430 + 8) * 0x10 + -0x10 + lVar25);
                  local_408.offset.offset =
                       *(undefined8 *)(*(long *)((long)local_430 + 8) * 0x10 + -8 + lVar25);
                  if ((local_408.target != dg::pta::NULLPTR) &&
                     (local_408.target != dg::pta::UNKNOWN_MEMORY)) {
                    dump_pointer(&local_408,"2");
                  }
                  dg::ADT::
                  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                  ::const_iterator::operator++((const_iterator *)local_430);
                  uVar17 = local_428._8_8_;
                } while (local_430 != (undefined1  [8])0x0 || local_428._8_8_ != 0);
              }
              uVar10 = 2;
            }
            auVar36 = ZEXT416(0x5341494c);
            switch(local_410) {
            case 0:
              if (*(int *)((long)puVar11 + 3) == 0x5341494c && (int)*puVar11 == 0x4c414f4e) {
                pcVar19 = "NO";
                pcVar18 = "NO";
                pcVar22 = "true";
                if (uVar10 != 1) {
                  pcVar23 = "buggy";
                  pcVar18 = "EXPECTEDFAIL_NO";
                  pcVar24 = "inadequate";
LAB_0010d2ab:
                  pcVar18 = pcVar18 + 0xd;
                  if (uVar10 != 2) goto LAB_0010d345;
                  goto LAB_0010d315;
                }
LAB_0010d3a7:
                printf("  pta %s %s ex %s\n",pcVar22,pcVar19,pcVar18);
              }
              break;
            case 1:
              if (*puVar11 == 0x5341494c4159414d) {
LAB_0010d278:
                pcVar18 = "MAY";
                pcVar22 = "false";
                pcVar19 = "NO";
                if (uVar10 != 1) {
                  pcVar23 = "toomuch";
                  pcVar18 = "EXPECTEDFAIL_MAY";
                  pcVar24 = "true";
                  goto LAB_0010d2ab;
                }
                goto LAB_0010d3a7;
              }
              break;
            case 2:
              if ((char)puVar11[1] == 'S' && *puVar11 == 0x41494c415453554d) {
                if (uVar10 == 1) {
                  pcVar18 = "MUST";
                  pcVar22 = "false";
LAB_0010d3a0:
                  pcVar19 = "NO";
                  goto LAB_0010d3a7;
                }
                pcVar18 = "MUST";
                pcVar22 = "inadequate";
                pcVar19 = "MAY";
                pcVar23 = "true";
                if (uVar10 == 2) goto LAB_0010d3a7;
LAB_0010d345:
                pcVar22 = pcVar23;
                pcVar19 = "MUST";
                goto LAB_0010d3a7;
              }
              break;
            case 5:
              if ((int)puVar11[1] == 0x5341494c && *puVar11 == 0x414c414954524150)
              goto LAB_0010d278;
              break;
            case 0xd:
              iVar20 = (int)puVar11[2];
              auVar35[0] = -((char)iVar20 == auVar36[0]);
              auVar35[1] = -((char)((uint)iVar20 >> 8) == auVar36[1]);
              auVar35[2] = -((char)((uint)iVar20 >> 0x10) == auVar36[2]);
              auVar35[3] = -((char)((uint)iVar20 >> 0x18) == auVar36[3]);
              auVar35[4] = 0xff;
              auVar35[5] = 0xff;
              auVar35[6] = 0xff;
              auVar35[7] = 0xff;
              auVar35[8] = 0xff;
              auVar35[9] = 0xff;
              auVar35[10] = 0xff;
              auVar35[0xb] = 0xff;
              auVar35[0xc] = 0xff;
              auVar35[0xd] = 0xff;
              auVar35[0xe] = 0xff;
              auVar35[0xf] = 0xff;
              auVar32[0] = -((char)*puVar11 == s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0]);
              auVar32[1] = -(*(char *)((long)puVar11 + 1) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[1]);
              auVar32[2] = -(*(char *)((long)puVar11 + 2) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[2]);
              auVar32[3] = -(*(char *)((long)puVar11 + 3) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[3]);
              auVar32[4] = -(*(char *)((long)puVar11 + 4) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[4]);
              auVar32[5] = -(*(char *)((long)puVar11 + 5) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[5]);
              auVar32[6] = -(*(char *)((long)puVar11 + 6) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[6]);
              auVar32[7] = -(*(char *)((long)puVar11 + 7) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[7]);
              auVar32[8] = -((char)puVar11[1] == s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[8]);
              auVar32[9] = -(*(char *)((long)puVar11 + 9) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[9]);
              auVar32[10] = -(*(char *)((long)puVar11 + 10) ==
                             s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[10]);
              auVar32[0xb] = -(*(char *)((long)puVar11 + 0xb) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0xb]);
              auVar32[0xc] = -(*(char *)((long)puVar11 + 0xc) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0xc]);
              auVar32[0xd] = -(*(char *)((long)puVar11 + 0xd) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0xd]);
              auVar32[0xe] = -(*(char *)((long)puVar11 + 0xe) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0xe]);
              auVar32[0xf] = -(*(char *)((long)puVar11 + 0xf) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0xf]);
              auVar32 = auVar32 & auVar35;
              if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff) {
                pcVar18 = "EXPECTEDFAIL_NO";
                pcVar22 = "false";
                pcVar19 = "NO";
                if (uVar10 == 1) goto LAB_0010d3a7;
LAB_0010d300:
                pcVar22 = "true";
                if (uVar10 == 1) goto LAB_0010d3a0;
                pcVar23 = pcVar22;
                pcVar24 = pcVar22;
                if (uVar10 == 3) goto LAB_0010d345;
LAB_0010d315:
                pcVar22 = pcVar24;
                pcVar19 = "MAY";
                goto LAB_0010d3a7;
              }
              break;
            case 0xe:
              auVar34[0] = -(*(char *)((long)puVar11 + 5) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x10]);
              auVar34[1] = -(*(char *)((long)puVar11 + 6) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x11]);
              auVar34[2] = -(*(char *)((long)puVar11 + 7) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x12]);
              auVar34[3] = -((char)puVar11[1] == s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x13]);
              auVar34[4] = -(*(char *)((long)puVar11 + 9) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x14]);
              auVar34[5] = -(*(char *)((long)puVar11 + 10) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x15]);
              auVar34[6] = -(*(char *)((long)puVar11 + 0xb) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x16]);
              auVar34[7] = -(*(char *)((long)puVar11 + 0xc) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x17]);
              auVar34[8] = -(*(char *)((long)puVar11 + 0xd) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x18]);
              auVar34[9] = -(*(char *)((long)puVar11 + 0xe) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x19]);
              auVar34[10] = -(*(char *)((long)puVar11 + 0xf) ==
                             s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x1a]);
              auVar34[0xb] = -((char)puVar11[2] == s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x1b]
                              );
              auVar34[0xc] = -(*(char *)((long)puVar11 + 0x11) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x1c]);
              auVar34[0xd] = -(*(char *)((long)puVar11 + 0x12) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x1d]);
              auVar34[0xe] = -(*(char *)((long)puVar11 + 0x13) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x1e]);
              auVar34[0xf] = -(*(char *)((long)puVar11 + 0x14) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x1f]);
              auVar31[0] = -((char)*puVar11 == s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x20]);
              auVar31[1] = -(*(char *)((long)puVar11 + 1) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x21]);
              auVar31[2] = -(*(char *)((long)puVar11 + 2) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x22]);
              auVar31[3] = -(*(char *)((long)puVar11 + 3) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x23]);
              auVar31[4] = -(*(char *)((long)puVar11 + 4) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x24]);
              auVar31[5] = -(*(char *)((long)puVar11 + 5) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x25]);
              auVar31[6] = -(*(char *)((long)puVar11 + 6) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x26]);
              auVar31[7] = -(*(char *)((long)puVar11 + 7) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x27]);
              auVar31[8] = -((char)puVar11[1] == s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x28]);
              auVar31[9] = -(*(char *)((long)puVar11 + 9) ==
                            s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x29]);
              auVar31[10] = -(*(char *)((long)puVar11 + 10) ==
                             s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x2a]);
              auVar31[0xb] = -(*(char *)((long)puVar11 + 0xb) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x2b]);
              auVar31[0xc] = -(*(char *)((long)puVar11 + 0xc) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x2c]);
              auVar31[0xd] = -(*(char *)((long)puVar11 + 0xd) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x2d]);
              auVar31[0xe] = -(*(char *)((long)puVar11 + 0xe) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x2e]);
              auVar31[0xf] = -(*(char *)((long)puVar11 + 0xf) ==
                              s_EXPECTEDFAIL_NOATEDFAIL_MAYALIAS_00114020[0x2f]);
              auVar31 = auVar31 & auVar34;
              if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) == 0xffff) {
                pcVar18 = "EXPECTEDFAIL_MAY";
                if ((uVar10 & 0xfffffffd) == 1) goto LAB_0010d300;
                pcVar18 = "EXPECTEDFAIL_MAY";
                pcVar22 = "unknown";
                pcVar19 = "MUST";
                pcVar24 = "inadequate";
                if (uVar10 != 2) goto LAB_0010d3a7;
                goto LAB_0010d315;
              }
            }
          }
          break;
        case 0xd:
          iVar20 = (int)puVar11[2];
          auVar33[0] = -((char)iVar20 == 'L');
          auVar33[1] = -((char)((uint)iVar20 >> 8) == 'I');
          auVar33[2] = -((char)((uint)iVar20 >> 0x10) == 'A');
          auVar33[3] = -((char)((uint)iVar20 >> 0x18) == 'S');
          auVar33[4] = 0xff;
          auVar33[5] = 0xff;
          auVar33[6] = 0xff;
          auVar33[7] = 0xff;
          auVar33[8] = 0xff;
          auVar33[9] = 0xff;
          auVar33[10] = 0xff;
          auVar33[0xb] = 0xff;
          auVar33[0xc] = 0xff;
          auVar33[0xd] = 0xff;
          auVar33[0xe] = 0xff;
          auVar33[0xf] = 0xff;
          auVar36[0] = -((char)*puVar11 == 'E');
          auVar36[1] = -(*(char *)((long)puVar11 + 1) == 'X');
          auVar36[2] = -(*(char *)((long)puVar11 + 2) == 'P');
          auVar36[3] = -(*(char *)((long)puVar11 + 3) == 'E');
          auVar36[4] = -(*(char *)((long)puVar11 + 4) == 'C');
          auVar36[5] = -(*(char *)((long)puVar11 + 5) == 'T');
          auVar36[6] = -(*(char *)((long)puVar11 + 6) == 'E');
          auVar36[7] = -(*(char *)((long)puVar11 + 7) == 'D');
          auVar36[8] = -((char)puVar11[1] == 'F');
          auVar36[9] = -(*(char *)((long)puVar11 + 9) == 'A');
          auVar36[10] = -(*(char *)((long)puVar11 + 10) == 'I');
          auVar36[0xb] = -(*(char *)((long)puVar11 + 0xb) == 'L');
          auVar36[0xc] = -(*(char *)((long)puVar11 + 0xc) == '_');
          auVar36[0xd] = -(*(char *)((long)puVar11 + 0xd) == 'N');
          auVar36[0xe] = -(*(char *)((long)puVar11 + 0xe) == 'O');
          auVar36[0xf] = -(*(char *)((long)puVar11 + 0xf) == 'A');
          goto LAB_0010ca65;
        case 0xe:
          auVar33[0] = -(*(char *)((long)puVar11 + 5) == 'T');
          auVar33[1] = -(*(char *)((long)puVar11 + 6) == 'E');
          auVar33[2] = -(*(char *)((long)puVar11 + 7) == 'D');
          auVar33[3] = -((char)puVar11[1] == 'F');
          auVar33[4] = -(*(char *)((long)puVar11 + 9) == 'A');
          auVar33[5] = -(*(char *)((long)puVar11 + 10) == 'I');
          auVar33[6] = -(*(char *)((long)puVar11 + 0xb) == 'L');
          auVar33[7] = -(*(char *)((long)puVar11 + 0xc) == '_');
          auVar33[8] = -(*(char *)((long)puVar11 + 0xd) == 'M');
          auVar33[9] = -(*(char *)((long)puVar11 + 0xe) == 'A');
          auVar33[10] = -(*(char *)((long)puVar11 + 0xf) == 'Y');
          auVar33[0xb] = -((char)puVar11[2] == 'A');
          auVar33[0xc] = -(*(char *)((long)puVar11 + 0x11) == 'L');
          auVar33[0xd] = -(*(char *)((long)puVar11 + 0x12) == 'I');
          auVar33[0xe] = -(*(char *)((long)puVar11 + 0x13) == 'A');
          auVar33[0xf] = -(*(char *)((long)puVar11 + 0x14) == 'S');
          auVar36[0] = -((char)*puVar11 == 'E');
          auVar36[1] = -(*(char *)((long)puVar11 + 1) == 'X');
          auVar36[2] = -(*(char *)((long)puVar11 + 2) == 'P');
          auVar36[3] = -(*(char *)((long)puVar11 + 3) == 'E');
          auVar36[4] = -(*(char *)((long)puVar11 + 4) == 'C');
          auVar36[5] = -(*(char *)((long)puVar11 + 5) == 'T');
          auVar36[6] = -(*(char *)((long)puVar11 + 6) == 'E');
          auVar36[7] = -(*(char *)((long)puVar11 + 7) == 'D');
          auVar36[8] = -((char)puVar11[1] == 'F');
          auVar36[9] = -(*(char *)((long)puVar11 + 9) == 'A');
          auVar36[10] = -(*(char *)((long)puVar11 + 10) == 'I');
          auVar36[0xb] = -(*(char *)((long)puVar11 + 0xb) == 'L');
          auVar36[0xc] = -(*(char *)((long)puVar11 + 0xc) == '_');
          auVar36[0xd] = -(*(char *)((long)puVar11 + 0xd) == 'M');
          auVar36[0xe] = -(*(char *)((long)puVar11 + 0xe) == 'A');
          auVar36[0xf] = -(*(char *)((long)puVar11 + 0xf) == 'Y');
LAB_0010ca65:
          auVar36 = auVar36 & auVar33;
          if ((ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) != 0xffff) break;
          goto LAB_0010ca78;
        }
switchD_0010c9bd_caseD_3:
        puVar27 = puVar27 + 1;
      } while (puVar27 != puVar1);
    }
    local_3b8.super_LLVMPointerAnalysis._vptr_LLVMPointerAnalysis =
         (_func_int **)&PTR_hasPointsTo_00118800;
    std::
    unique_ptr<dg::pta::LLVMPointerGraphBuilder,_std::default_delete<dg::pta::LLVMPointerGraphBuilder>_>
    ::~unique_ptr(&local_3b8._builder);
    if (local_3b8.PTA._M_t.
        super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
        ._M_t.
        super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
        .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>)
        0x0) {
      (*(*(_func_int ***)
          local_3b8.PTA._M_t.
          super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
          ._M_t.
          super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
          .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl)[1])();
    }
    local_3b8.PTA._M_t.
    super___uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>.
    _M_t.
    super__Tuple_impl<0UL,_dg::pta::PointerAnalysis_*,_std::default_delete<dg::pta::PointerAnalysis>_>
    .super__Head_base<0UL,_dg::pta::PointerAnalysis_*,_false>._M_head_impl =
         (__uniq_ptr_data<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>,_true,_true>
          )(__uniq_ptr_impl<dg::pta::PointerAnalysis,_std::default_delete<dg::pta::PointerAnalysis>_>
            )0x0;
    dg::LLVMPointerAnalysis::~LLVMPointerAnalysis((LLVMPointerAnalysis *)(local_3c0 + 8));
    iVar20 = 0;
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr(&local_3c8);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)local_3c0);
  SlicerOptions::~SlicerOptions((SlicerOptions *)local_2a0);
  return iVar20;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-pta-ben", context, options);
    if (!M)
        return 1;

    TimeMeasure tm;
    auto &opts = options.dgOptions.PTAOptions;

    DGLLVMPointerAnalysis PTA(M.get(), opts);

    tm.start();

    PTA.run();

    tm.stop();
    tm.report("INFO: Pointer analysis took");

    evalPTA(&PTA);

    return 0;
}